

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testaniminter.cpp
# Opt level: O1

void change_setting_proc(Am_Object *cmd)

{
  uint uVar1;
  char cVar2;
  Am_Value *pAVar3;
  long *plVar4;
  Am_Wrapper *pAVar5;
  ostream *poVar6;
  Am_Inter_Trace_Options AVar7;
  Am_Object *this;
  Am_Input_Char c;
  Am_Image_Array icon;
  int i;
  Am_Object inter;
  Am_Input_Char local_12c;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Image_Array local_110 [8];
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  int local_1c;
  Am_Object local_18;
  
  Am_Object::Get_Object((ushort)&local_18,(ulong)cmd);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x11b);
  Am_Input_Char::Am_Input_Char(&local_12c,pAVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- got ",9);
  plVar4 = (long *)operator<<((ostream *)&std::cout,(Am_Input_Char *)&local_12c);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  cVar2 = Am_Input_Char::As_Char();
  switch(cVar2) {
  case 'd':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," debugging all\n",0xf)
    ;
    AVar7 = Am_INTER_TRACE_ALL;
    std::ostream::flush();
    break;
  case 'e':
  case 'f':
  case 'j':
  case 'k':
  case 'm':
  case 'o':
  case 'p':
  case 'r':
switchD_00103adc_caseD_65:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Illegal, want:\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," q = quit.\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," s = stop all animations\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," g = go (start all animations\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," i = pick icon index\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," l = left, right controls of walker\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Debugging:\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    d=full-debug, h=short-debug, n=no-debug, S=setting only\n"
               ,0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::ostream::flush();
    goto LAB_001043b7;
  case 'g':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," go--starting all\n",0x12);
    std::ostream::flush();
    Am_Object::Am_Object(&local_68,&anim1);
    Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_78,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_68,(Am_Object_Data *)&local_70,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_78,0,0,true);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_68);
    Am_Object::Am_Object(&local_80,&anim2);
    Am_Object::Am_Object(&local_88,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_90,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_80,(Am_Object_Data *)&local_88,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_90,0,0,true);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_88);
    Am_Object::~Am_Object(&local_80);
    Am_Object::Am_Object(&local_98,&anim3);
    Am_Object::Am_Object(&local_a0,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_a8,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_98,(Am_Object_Data *)&local_a0,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_a8,0,0,true);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&local_98);
    Am_Object::Am_Object(&local_b0,&anim4);
    Am_Object::Am_Object(&local_b8,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_c0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_b0,(Am_Object_Data *)&local_b8,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_c0,0,0,true);
    Am_Object::~Am_Object(&local_c0);
    Am_Object::~Am_Object(&local_b8);
    Am_Object::~Am_Object(&local_b0);
    Am_Object::Am_Object(&local_c8,&anim5);
    Am_Object::Am_Object(&local_d0,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_d8,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_c8,(Am_Object_Data *)&local_d0,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_d8,0,0,true);
    Am_Object::~Am_Object(&local_d8);
    Am_Object::~Am_Object(&local_d0);
    Am_Object::~Am_Object(&local_c8);
    Am_Object::Am_Object(&local_e0,&anim6);
    Am_Object::Am_Object(&local_e8,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_f0,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_e0,(Am_Object_Data *)&local_e8,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_f0,0,0,true);
    Am_Object::~Am_Object(&local_f0);
    Am_Object::~Am_Object(&local_e8);
    Am_Object::~Am_Object(&local_e0);
    Am_Object::Am_Object(&local_f8,&anim7);
    Am_Object::Am_Object(&local_100,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_108,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor((Am_Object_Data *)&local_f8,(Am_Object_Data *)&local_100,
                        (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_108,0,0,true);
    Am_Object::~Am_Object(&local_108);
    Am_Object::~Am_Object(&local_100);
    this = &local_f8;
    goto LAB_00104279;
  case 'h':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," debugging SHORT\n",0x11);
    AVar7 = Am_INTER_TRACE_SHORT;
    std::ostream::flush();
    break;
  case 'i':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"index of picture to load [0..11]: ",0x22);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&local_1c);
    pAVar3 = (Am_Value *)Am_Value_List::Get_Nth(0x109388);
    Am_Image_Array::Am_Image_Array(local_110,pAVar3);
    pAVar5 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_110);
    Am_Object::Set(0x93b8,(Am_Wrapper *)0xb0,(ulong)pAVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Lists are: right = ",0x13);
    poVar6 = (ostream *)operator<<((ostream *)&std::cout,(Am_Value_List *)indices_right);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n left = ",9);
    plVar4 = (long *)operator<<(poVar6,(Am_Value_List *)indices_left);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::ostream::flush();
    Am_Image_Array::~Am_Image_Array(local_110);
    goto LAB_001043b7;
  case 'l':
    Am_Object::Am_Object(&local_118,&anim7);
    Am_Object::Am_Object(&local_120,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Stop_Char;
    Am_Object::Am_Object(&local_128,(Am_Object *)&Am_No_Object);
    Am_Stop_Interactor((Am_Object_Data *)&local_118,(Am_Object_Data *)&local_120,
                       (Am_Input_Char *)(ulong)uVar1,(Am_Object_Data *)&local_128,0,0,true);
    Am_Object::~Am_Object(&local_128);
    Am_Object::~Am_Object(&local_120);
    this = &local_118;
    goto LAB_00104279;
  case 'n':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," debugging none\n",0x10);
    AVar7 = Am_INTER_TRACE_NONE;
    std::ostream::flush();
    break;
  case 'q':
    Am_Exit_Main_Event_Loop();
    goto LAB_001043b7;
  case 's':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopping all\n",0xd);
    std::ostream::flush();
    Am_Object::Am_Object(&local_28,&anim1);
    Am_Abort_Interactor((Am_Object_Data *)&local_28,true);
    Am_Object::~Am_Object(&local_28);
    Am_Object::Am_Object(&local_30,&anim2);
    Am_Abort_Interactor((Am_Object_Data *)&local_30,true);
    Am_Object::~Am_Object(&local_30);
    Am_Object::Am_Object(&local_38,&anim3);
    Am_Abort_Interactor((Am_Object_Data *)&local_38,true);
    Am_Object::~Am_Object(&local_38);
    Am_Object::Am_Object(&local_40,&anim4);
    Am_Abort_Interactor((Am_Object_Data *)&local_40,true);
    Am_Object::~Am_Object(&local_40);
    Am_Object::Am_Object(&local_48,&anim5);
    Am_Abort_Interactor((Am_Object_Data *)&local_48,true);
    Am_Object::~Am_Object(&local_48);
    Am_Object::Am_Object(&local_50,&anim6);
    Am_Abort_Interactor((Am_Object_Data *)&local_50,true);
    Am_Object::~Am_Object(&local_50);
    Am_Object::Am_Object(&local_58,&anim7);
    Am_Abort_Interactor((Am_Object_Data *)&local_58,true);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Am_Object(&local_60,&anim8);
    Am_Abort_Interactor((Am_Object_Data *)&local_60,true);
    this = &local_60;
LAB_00104279:
    Am_Object::~Am_Object(this);
    goto LAB_001043b7;
  default:
    if (cVar2 != 'S') goto switchD_00103adc_caseD_65;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," debugging setting only\n",0x18);
    std::ostream::flush();
    AVar7 = Am_INTER_TRACE_SETTING;
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
  }
  Am_Set_Inter_Trace(AVar7);
LAB_001043b7:
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  std::cout << "---- got " << c << std::endl;
  switch (c.As_Char()) {
  case 'q':
    Am_Exit_Main_Event_Loop();
    break;
  case 's':
    std::cout << "stopping all\n" << std::flush;
    Am_Abort_Interactor(anim1);
    Am_Abort_Interactor(anim2);
    Am_Abort_Interactor(anim3);
    Am_Abort_Interactor(anim4);
    Am_Abort_Interactor(anim5);
    Am_Abort_Interactor(anim6);
    Am_Abort_Interactor(anim7);
    Am_Abort_Interactor(anim8);
    break;
  case 'g':
    std::cout << " go--starting all\n" << std::flush;
    Am_Start_Interactor(anim1);
    Am_Start_Interactor(anim2);
    Am_Start_Interactor(anim3);
    Am_Start_Interactor(anim4);
    Am_Start_Interactor(anim5);
    Am_Start_Interactor(anim6);
    Am_Start_Interactor(anim7);
    break;
  case 'i': {
    std::cout << "index of picture to load [0..11]: " << std::flush;
    int i;
    std::cin >> i;
    Am_Image_Array icon = pixmap_images.Get_Nth(i);
    eye_icon.Set(Am_IMAGE, icon);
    std::cout << "Lists are: right = " << indices_right
              << "\n left = " << indices_left << std::endl
              << std::flush;
    break;
  }
  case 'l': {
    Am_Stop_Interactor(anim7);
    break;
  }
  case 'd':
    std::cout << " debugging all\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    break;
  case 'h':
    std::cout << " debugging SHORT\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_SHORT);
    break;
  case 'n':
    std::cout << " debugging none\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    break;
  case 'S':
    std::cout << " debugging setting only\n" << std::flush;
    Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    Am_Set_Inter_Trace(Am_INTER_TRACE_SETTING);
    break;
  default:
    std::cout << "** Illegal, want:\n"
              << " q = quit.\n"
              << " s = stop all animations\n"
              << " g = go (start all animations\n"
              << " i = pick icon index\n"
              << " l = left, right controls of walker\n"
              << " Debugging:\n"
              << "    d=full-debug, h=short-debug, n=no-debug, S=setting only\n"
              << std::endl
              << std::flush;
    break;
  } // end switch
}